

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMain.cpp
# Opt level: O2

void __thiscall MinVR::VRMain::renderOnAllDisplays(VRMain *this)

{
  pointer ppVVar1;
  runtime_error *this_00;
  pointer ppVVar2;
  iterator it;
  allocator<char> local_119;
  VRCompositeRenderHandler compositeHandler;
  string local_f8 [32];
  string local_d8;
  VRDataIndex renderState;
  
  if (this->_initialized != false) {
    VRDataIndex::VRDataIndex(&renderState);
    std::__cxx11::string::string<std::allocator<char>>
              (local_f8,"RenderState",(allocator<char> *)&compositeHandler);
    std::__cxx11::string::_M_assign((string *)&renderState._indexName);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&compositeHandler,"InitRender",&local_119);
    VRDataIndex::addData
              (&local_d8,&renderState,(string *)&compositeHandler,(uint)(this->_frame == 0));
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&compositeHandler);
    if ((this->_displayGraphs).
        super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->_displayGraphs).
        super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      VRCompositeRenderHandler::VRCompositeRenderHandler(&compositeHandler,&this->_renderHandlers);
      for (ppVVar2 = (this->_displayGraphs).
                     super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppVVar2 !=
          (this->_displayGraphs).
          super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppVVar2 = ppVVar2 + 1) {
        (*(*ppVVar2)->_vptr_VRDisplayNode[4])(*ppVVar2,&renderState,&compositeHandler);
      }
      for (ppVVar1 = (this->_displayGraphs).
                     super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppVVar1 != ppVVar2;
          ppVVar1 = ppVVar1 + 1) {
        (*(*ppVVar1)->_vptr_VRDisplayNode[5])(*ppVVar1,&renderState);
        ppVVar2 = (this->_displayGraphs).
                  super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      VRCompositeRenderHandler::~VRCompositeRenderHandler(&compositeHandler);
    }
    if (this->_net != (VRNetInterface *)0x0) {
      (*this->_net->_vptr_VRNetInterface[1])();
    }
    ppVVar2 = (this->_displayGraphs).
              super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppVVar1 = (this->_displayGraphs).
              super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppVVar2 != ppVVar1) {
      for (; ppVVar2 != ppVVar1; ppVVar2 = ppVVar2 + 1) {
        (*(*ppVVar2)->_vptr_VRDisplayNode[6])(*ppVVar2,&renderState);
        ppVVar1 = (this->_displayGraphs).
                  super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    this->_frame = this->_frame + 1;
    VRDataIndex::~VRDataIndex(&renderState);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"VRMain not initialized.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void VRMain::renderOnAllDisplays() {

  if (!_initialized) throw std::runtime_error("VRMain not initialized.");

	VRDataIndex renderState;
  renderState.setName("RenderState");
	renderState.addData("InitRender", (int)(_frame == 0));

	if (!_displayGraphs.empty()) {
		VRCompositeRenderHandler compositeHandler(_renderHandlers);
		for (std::vector<VRDisplayNode*>::iterator it = _displayGraphs.begin(); it != _displayGraphs.end(); ++it) (*it)->render(&renderState, &compositeHandler);

		// TODO: Advanced: if you are really trying to optimize performance, this
		// is where you might want to add an idle callback.  Here, it's
		// possible that the CPU is idle, but the GPU is still processing
		// graphics comamnds.

		for (std::vector<VRDisplayNode*>::iterator it = _displayGraphs.begin(); it != _displayGraphs.end(); ++it) (*it)->waitForRenderToComplete(&renderState);
	}

	// SYNCHRONIZATION POINT #2: When this function returns we know that
	// all nodes have finished rendering on all their attached display
	// devices.  So, after this, we will be ready to "swap buffers",
	// simultaneously displaying these new renderings on all nodes.
	if (_net != NULL) {
		_net->syncSwapBuffersAcrossAllNodes();
	}

	if (!_displayGraphs.empty()) {
		for (std::vector<VRDisplayNode*>::iterator it = _displayGraphs.begin(); it != _displayGraphs.end(); ++it) (*it)->displayFinishedRendering(&renderState);
	}

	_frame++;
}